

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O2

bool __thiscall leveldb::Version::RecordReadSample(Version *this,Slice internal_key)

{
  bool bVar1;
  size_t n;
  ulong uVar2;
  Slice user_key;
  State state;
  GetStats local_28;
  int local_18;
  
  uVar2 = internal_key.size_;
  user_key.data_ = internal_key.data_;
  if ((7 < uVar2) && ((user_key.data_[uVar2 - 8] & 0xfeU) == 0)) {
    local_18 = 0;
    user_key.size_ = uVar2 - 8;
    ForEachOverlapping(this,user_key,internal_key,&local_28,
                       RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
                       FileMetaData__);
    if (local_18 < 2) {
      bVar1 = false;
    }
    else {
      bVar1 = UpdateStats(this,&local_28);
    }
    return bVar1;
  }
  return false;
}

Assistant:

inline bool ParseInternalKey(const Slice& internal_key,
                             ParsedInternalKey* result) {
  const size_t n = internal_key.size();
  if (n < 8) return false;
  uint64_t num = DecodeFixed64(internal_key.data() + n - 8);
  uint8_t c = num & 0xff;
  result->sequence = num >> 8;
  result->type = static_cast<ValueType>(c);
  result->user_key = Slice(internal_key.data(), n - 8);
  return (c <= static_cast<uint8_t>(kTypeValue));
}